

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.c
# Opt level: O0

yrmcds_error
yrmcds_incr(yrmcds *c,char *key,size_t key_len,uint64_t value,int quiet,uint32_t *serial)

{
  yrmcds_command cmd;
  char local_58 [8];
  char extras [20];
  uint32_t *serial_local;
  int quiet_local;
  uint64_t value_local;
  size_t key_len_local;
  char *key_local;
  yrmcds *c_local;
  
  if (((c == (yrmcds *)0x0) || (key == (char *)0x0)) || (key_len == 0)) {
    c_local._4_4_ = YRMCDS_BAD_ARGUMENT;
  }
  else {
    unique0x10000116 = serial;
    if (c->text_mode == 0) {
      hton64(value,local_58);
      hton64(0,extras);
      hton32(0xffffffff,extras + 8);
      cmd = YRMCDS_CMD_INCREMENT;
      if (quiet != 0) {
        cmd = YRMCDS_CMD_INCREMENTQ;
      }
      c_local._4_4_ =
           send_command(c,cmd,0,stack0xffffffffffffffc0,key_len,key,0x14,local_58,0,(char *)0x0);
    }
    else {
      c_local._4_4_ = yrmcds_text_incr(c,key,key_len,value,quiet,serial);
    }
  }
  return c_local._4_4_;
}

Assistant:

yrmcds_error yrmcds_incr(yrmcds* c, const char* key, size_t key_len,
                         uint64_t value, int quiet, uint32_t* serial) {
    if( c == NULL || key == NULL || key_len == 0 )
        return YRMCDS_BAD_ARGUMENT;

    if( c->text_mode )
        return yrmcds_text_incr(c, key, key_len, value, quiet, serial);

    char extras[20];
    hton64(value, extras);
    hton64((uint64_t)0, &extras[8]);
    hton32(~(uint32_t)0, &extras[16]);
    return send_command(c, quiet ? YRMCDS_CMD_INCREMENTQ : YRMCDS_CMD_INCREMENT,
                        0, serial, key_len, key,
                        sizeof(extras), extras, 0, NULL);
}